

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

TSTNode<unsigned_short> * __thiscall
BurstRecursive<unsigned_short>::operator()
          (BurstRecursive<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,unsigned_short *oracle,
          size_t depth)

{
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar1;
  pointer ppuVar2;
  uchar *puVar3;
  bool bVar4;
  TSTNode<unsigned_short> *pTVar5;
  TSTNode<unsigned_short> *pTVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_00;
  ulong uVar11;
  unsigned_short uVar12;
  ulong uVar13;
  long lVar14;
  BurstSimple<unsigned_short> local_51;
  BurstRecursive<unsigned_short> *local_50;
  TSTNode<unsigned_short> *local_48;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_40;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_38;
  
  local_50 = this;
  local_48 = BurstSimple<unsigned_short>::operator()(&local_51,bucket,oracle,depth);
  pvVar1 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
           (local_48->buckets)._M_elems[0];
  bucket_00 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
              (local_48->buckets)._M_elems[1];
  local_38 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (local_48->buckets)._M_elems[2];
  uVar8 = (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  ppuVar2 = (pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar10 = (long)(pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3;
  lVar14 = ((long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start >> 3) + uVar10;
  if (((long)(local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3) + lVar14 != uVar8) {
    __assert_fail("bucket0->size() + bucket1->size() + bucket2->size() == bucket.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                  ,0x6c,
                  "TSTNode<CharT> *BurstRecursive<unsigned short>::operator()(const BucketT &, CharT *, size_t) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                 );
  }
  uVar8 = (ulong)((float)uVar8 * 0.7);
  uVar9 = 100;
  if (100 < (uint)uVar8) {
    uVar9 = uVar8 & 0xffffffff;
  }
  if (uVar9 < uVar10) {
    uVar7 = 1;
    uVar8 = 0;
    do {
      puVar3 = ppuVar2[uVar8];
      if (puVar3 == (uchar *)0x0) goto LAB_001a71f4;
      if (puVar3[depth] == '\0') {
        uVar12 = 0;
      }
      else {
        uVar12 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
      }
      oracle[uVar8] = uVar12;
      uVar8 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar8 < uVar10);
    local_40 = bucket_00;
    pTVar5 = operator()(local_50,pvVar1,oracle,depth);
    (local_48->buckets)._M_elems[0] = pTVar5;
    ppuVar2 = (pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar2 != (pointer)0x0) {
      operator_delete(ppuVar2);
    }
    operator_delete(pvVar1);
    *(byte *)&(local_48->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(local_48->is_tst).super__Base_bitset<1UL>._M_w | 1;
    bucket_00 = local_40;
  }
  pTVar5 = local_48;
  ppuVar2 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3;
  if ((uVar9 < uVar8) && ((char)local_48->pivot != '\0')) {
    uVar11 = 0;
    uVar13 = 1;
    do {
      puVar3 = ppuVar2[uVar11];
      if (puVar3 == (uchar *)0x0) goto LAB_001a71f4;
      if (puVar3[depth + 2] == '\0') {
        uVar12 = 0;
      }
      else {
        uVar12 = CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
      }
      (oracle + uVar10)[uVar11] = uVar12;
      bVar4 = uVar13 < uVar8;
      uVar11 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar4);
    pTVar6 = operator()(local_50,bucket_00,oracle + uVar10,depth + 2);
    (pTVar5->buckets)._M_elems[1] = pTVar6;
    ppuVar2 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar2 != (pointer)0x0) {
      operator_delete(ppuVar2);
    }
    operator_delete(bucket_00);
    *(byte *)&(pTVar5->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar5->is_tst).super__Base_bitset<1UL>._M_w | 2;
  }
  pvVar1 = local_38;
  ppuVar2 = (local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3;
  if (uVar9 < uVar8) {
    uVar7 = 1;
    uVar10 = 0;
    do {
      puVar3 = ppuVar2[uVar10];
      if (puVar3 == (uchar *)0x0) {
LAB_001a71f4:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == '\0') {
        uVar12 = 0;
      }
      else {
        uVar12 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
      }
      (oracle + lVar14)[uVar10] = uVar12;
      uVar10 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar10 < uVar8);
    pTVar6 = operator()(local_50,local_38,oracle + lVar14,depth);
    (pTVar5->buckets)._M_elems[2] = pTVar6;
    ppuVar2 = (pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar2 != (pointer)0x0) {
      operator_delete(ppuVar2);
    }
    operator_delete(pvVar1);
    *(byte *)&(pTVar5->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar5->is_tst).super__Base_bitset<1UL>._M_w | 4;
  }
  return pTVar5;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t depth) const
	{
		debug() << "BurstRecursive() bucket.size()=" << bucket.size() << " depth=" << depth << "\n"; debug_indent;
		TSTNode<CharT>* new_node
			= BurstSimple<CharT>()(bucket, oracle, depth);
		BucketT* bucket0 = static_cast<BucketT*>(new_node->buckets[0]);
		BucketT* bucket1 = static_cast<BucketT*>(new_node->buckets[1]);
		BucketT* bucket2 = static_cast<BucketT*>(new_node->buckets[2]);
		const unsigned threshold = std::max(100u,
				unsigned(0.7f*bucket.size()));
		assert(bucket0->size() + bucket1->size() + bucket2->size()
				== bucket.size());
		size_t bsize = 0;
		const size_t bsize0 = bucket0->size();
		const size_t bsize1 = bucket1->size();
		if (bucket0->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket0: size()=" << bucket0->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket0->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket0)[i], depth);
			new_node->buckets[0] = this->operator()(*bucket0,
					oracle, depth);
			delete bucket0;
			new_node->is_tst[0] = true;
		}
		bsize += bsize0;
		if (bucket1->size() > threshold and not is_end(new_node->pivot)) {
			debug() << "BurstRecursive() bursting bucket1: size()=" << bucket1->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket1->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket1)[i], depth+sizeof(CharT));
			new_node->buckets[1] = this->operator()(*bucket1,
					oracle+bsize, depth+sizeof(CharT));
			delete bucket1;
			new_node->is_tst[1] = true;
		}
		bsize += bsize1;
		if (bucket2->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket2: size()=" << bucket2->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket2->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket2)[i], depth);
			new_node->buckets[2] = this->operator()(*bucket2,
					oracle+bsize, depth);
			delete bucket2;
			new_node->is_tst[2] = true;
		}
		return new_node;
	}